

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserProbModelXML.cpp
# Opt level: O0

void __thiscall
ParserProbModelXML::ConvertToLocalSFActionScope
          (ParserProbModelXML *this,Index sfI,Index aI,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *AValues,Scope *AScope)

{
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar1;
  reference __x;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RCX;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_R8;
  size_t i;
  vector<unsigned_int,_std::allocator<unsigned_int>_> allAValues;
  E *e;
  Scope *in_stack_ffffffffffffff78;
  Scope *in_stack_ffffffffffffff80;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_58;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffffb0;
  Index in_stack_ffffffffffffffbc;
  
  std::vector<Scope,_std::allocator<Scope>_>::at
            ((vector<Scope,_std::allocator<Scope>_> *)in_stack_ffffffffffffff80,
             (size_type)in_stack_ffffffffffffff78);
  Scope::operator=(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  IndexTools::JointToIndividualIndices(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb0);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::clear
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0xa8a32d);
  local_58 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
  while( true ) {
    this_00 = local_58;
    pvVar1 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(in_R8);
    if (pvVar1 <= this_00) break;
    pvVar1 = in_RCX;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](in_R8,(size_type)local_58);
    __x = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                    (pvVar1,(size_type)in_stack_ffffffffffffff78);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(this_00,__x);
    local_58 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               ((long)&(local_58->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                       _M_impl.super__Vector_impl_data._M_start + 1);
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(this_00);
  return;
}

Assistant:

void ParserProbModelXML::ConvertToLocalSFActionScope(Index sfI, Index aI, vector<Index>& AValues, Scope& AScope)
{
    try{
        AScope = _m_AScopes_Y.at(sfI);
    }
    catch(E& e)
    {
        e.Print();
    }
        
    vector<Index> allAValues = IndexTools::JointToIndividualIndices(aI, _m_ASizes);
    AValues.clear();
    for(size_t i = 0; i < AScope.size(); i++)
        AValues.push_back(allAValues.at(AScope[i]));
}